

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O1

uint32_t ivk::cmd_add64(void *el)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  char *__s;
  char *__s_00;
  char *__s_01;
  size_t sVar4;
  iterator iVar5;
  uint32_t uVar6;
  key_type local_50;
  
  if (el == (void *)0x0) {
    uVar6 = 2;
  }
  else {
    __s = get_attr_val((XMLElement **)el,"va");
    __s_00 = get_attr_val((XMLElement **)el,"vb");
    __s_01 = get_attr_val((XMLElement **)el,"vo");
    uVar6 = 5;
    if (__s_01 != (char *)0x0 && (__s_00 != (char *)0x0 && __s != (char *)0x0)) {
      paVar1 = &local_50.field_2;
      local_50._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar4);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                      *)gCmdMemMap_abi_cxx11_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar6 = 7;
      if (iVar5._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
        lVar2 = *(long *)iVar5._M_node[2]._M_parent;
        local_50._M_dataplus._M_p = (pointer)paVar1;
        sVar4 = strlen(__s_00);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s_00,__s_00 + sVar4);
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                        *)gCmdMemMap_abi_cxx11_,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (iVar5._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
          lVar3 = *(long *)iVar5._M_node[2]._M_parent;
          local_50._M_dataplus._M_p = (pointer)paVar1;
          sVar4 = strlen(__s_01);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s_01,__s_01 + sVar4)
          ;
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                          *)gCmdMemMap_abi_cxx11_,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar1) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (iVar5._M_node != (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
            *(long *)iVar5._M_node[2]._M_parent = lVar3 + lVar2;
            uVar6 = 0;
          }
        }
      }
    }
  }
  return uVar6;
}

Assistant:

uint32_t ivk::cmd_add64(void *el) {
    if(!el){
        return proc_param_err;
    }
    XMLElement** ppEl = (XMLElement**)el;
    XMLElement* pEl = *ppEl;

    const char* va = get_attr_val(ppEl,"va");
    const char* vb = get_attr_val(ppEl,"vb");
    const char* vo = get_attr_val(ppEl,"vo");
    if(!va || !vb || !vo){
        return proc_xml_err;
    }
    // get mem
    map<string,proc_data>::iterator it = gCmdMemMap.find(va);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    int64_t a = *(int64_t*)it->second.data;

    it = gCmdMemMap.find(vb);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    int64_t b = *(int64_t*)it->second.data;

    it = gCmdMemMap.find(vo);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    *(int64_t*)it->second.data = a+b;

    return proc_success;
}